

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall libserver::server::_process_request_(server *this)

{
  char *pcVar1;
  long lVar2;
  char *__first;
  allocator<char> local_199;
  string local_198 [32];
  string local_178 [32];
  undefined1 local_158 [8];
  string m;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [35];
  char local_4d [19];
  allocator local_3a;
  char local_39;
  string local_38 [8];
  string msg;
  server *this_local;
  
  msg.field_2._M_local_buf[0xf] = '\n';
  pcVar1 = std::find<char*,char>
                     (this->_incomming_message,this->_incomming_message + this->_num_bytes_read,
                      msg.field_2._M_local_buf + 0xf);
  if (pcVar1 != (char *)0x0) {
    __first = this->_incomming_message;
    local_39 = '\n';
    pcVar1 = std::find<char*,char>
                       (__first,this->_incomming_message + this->_num_bytes_read,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,__first,(long)pcVar1 - (long)__first,&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    std::copy<char*,char*>
              (this->_incomming_message + this->_num_bytes_read,&this->_is_reading,
               this->_incomming_message);
    local_4d[0] = '\n';
    pcVar1 = std::find<char*,char>
                       (this->_incomming_message,this->_incomming_message + this->_num_bytes_read,
                        local_4d);
    this->_num_bytes_read = this->_num_bytes_read + 100 + ((int)this - (int)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"lo",&local_71);
    lVar2 = std::__cxx11::string::find(local_38,(ulong)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    if (lVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"lo",&local_b9);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_98,(ulong)local_38);
      std::__cxx11::string::operator=((string *)&this->client_name,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
      _handle_login_req(this);
      _update_client_changed();
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e0,"ping",&local_e1);
      lVar2 = std::__cxx11::string::find(local_38,(ulong)local_e0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
      if (lVar2 == 0) {
        _handle_ping_req(this);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_108,"list",&local_109);
        lVar2 = std::__cxx11::string::find(local_38,(ulong)local_108);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator(&local_109);
        if (lVar2 == 0) {
          _handle_list_request(this);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_130,"echo",(allocator<char> *)(m.field_2._M_local_buf + 0xf));
          lVar2 = std::__cxx11::string::find(local_38,(ulong)local_130);
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator((allocator<char> *)(m.field_2._M_local_buf + 0xf));
          if (lVar2 == 0) {
            std::__cxx11::string::string((string *)local_158);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_198,"echo",&local_199);
            std::__cxx11::string::length();
            std::__cxx11::string::substr((ulong)local_178,(ulong)local_38);
            std::__cxx11::string::operator=((string *)local_158,local_178);
            std::__cxx11::string::~string(local_178);
            std::__cxx11::string::~string(local_198);
            std::allocator<char>::~allocator(&local_199);
            _display_message(this,(string *)local_158);
            std::__cxx11::string::~string((string *)local_158);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void libserver::server::_process_request_()
{
    /*
        Check if complete message is read till newline character
        Handle the corresponding request
    */
    if(std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n'))
    {

        // Store the message in a std::string container
        std::string msg(_incomming_message,(std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n')-_incomming_message));

        // Copy the read message into buffer (_incomming_message)
        std::copy(_incomming_message+_num_bytes_read,_incomming_message+_MAX_BUF_SIZE_,_incomming_message);

        _num_bytes_read -= (std::find(_incomming_message,_incomming_message+_num_bytes_read,'\n')-_incomming_message);
        if(msg.find(_LOGIN_REQUEST_)==0)
        {   
            client_name = msg.substr((_LOGIN_REQUEST_).length());
            _handle_login_req();
            libserver::_update_client_changed();
        }
        else if(msg.find(_PING_REQUEST_)==0)
        {
            _handle_ping_req();
        }
        else if(msg.find(_REQ_CLIENT_LIST_) == 0)
        {
            _handle_list_request();
        }
        else if(msg.find(_REQ_ECHO_)==0)
        {
            std::string m;
            m = msg.substr((_REQ_ECHO_).length());
            _display_message(m);
        }
    }
}